

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O0

void __thiscall
wallet::SelectionResult::
InsertInputs<std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
          (SelectionResult *this,
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs)

{
  string_view file;
  string_view msg;
  string_view func;
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined8 in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  size_t expected_count;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff48;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff60;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff68;
  int line;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_28 [24];
  size_t in_stack_fffffffffffffff0;
  char *pcVar4;
  
  line = (int)((ulong)in_RSI >> 0x20);
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  sVar1 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::size(in_stack_ffffffffffffff48);
  sVar2 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::size(in_stack_ffffffffffffff48);
  util::
  insert<std::shared_ptr<wallet::COutput>,std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  sVar3 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::size(in_stack_ffffffffffffff48);
  if (sVar3 == sVar1 + sVar2) {
    if (*(char **)(in_FS_OFFSET + 0x28) == pcVar4) {
      return;
    }
  }
  else {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_ffffffffffffff60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_ffffffffffffff60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_ffffffffffffff60);
    msg._M_str = in_stack_ffffffffffffffb8;
    msg._M_len = in_stack_ffffffffffffffb0;
    file._M_str = in_stack_ffffffffffffffa8;
    file._M_len = in_RDI;
    func._M_str = pcVar4;
    func._M_len = in_stack_fffffffffffffff0;
    StrFormatInternalBug_abi_cxx11_(msg,file,line,func);
    std::runtime_error::runtime_error((runtime_error *)this_00,local_28);
    if (*(char **)(in_FS_OFFSET + 0x28) == pcVar4) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void InsertInputs(const T& inputs)
    {
        // Store sum of combined input sets to check that the results have no shared UTXOs
        const size_t expected_count = m_selected_inputs.size() + inputs.size();
        util::insert(m_selected_inputs, inputs);
        if (m_selected_inputs.size() != expected_count) {
            throw std::runtime_error(STR_INTERNAL_BUG("Shared UTXOs among selection results"));
        }
    }